

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

string * __thiscall
fmt::v7::detail::stringifier::operator()[abi_cxx11_
          (string *__return_storage_ptr__,stringifier *this,handle h)

{
  memory_buffer buf;
  parse_context local_268;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> local_250;
  undefined **local_230;
  undefined1 *local_228;
  long local_220;
  size_t local_218;
  undefined1 local_210 [504];
  
  local_220 = 0;
  local_230 = &PTR_grow_00129cc0;
  local_218 = 500;
  local_268.format_str_.data_ = (char *)0x0;
  local_268.format_str_.size_ = 0;
  local_268.next_arg_id_ = 0;
  local_250.out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v7::detail::buffer<char>_>)&local_230;
  local_250.args_.desc_ = 0;
  local_250.loc_.locale_ = (void *)0x0;
  local_228 = local_210;
  (*h.custom_.format)(h.custom_.value,&local_268,&local_250);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_228,local_228 + local_220);
  local_230 = &PTR_grow_00129cc0;
  if (local_228 != local_210) {
    operator_delete(local_228,local_218);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(basic_format_arg<format_context>::handle h) const {
    memory_buffer buf;
    format_parse_context parse_ctx({});
    format_context format_ctx(buffer_appender<char>(buf), {}, {});
    h.format(parse_ctx, format_ctx);
    return to_string(buf);
  }